

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

void golf_data_init(void)

{
  undefined1 local_d;
  assetsys_error_t local_c;
  _Bool push_events;
  assetsys_error_t error;
  
  golf_thread_timer_init(&_main_thread_timer);
  golf_thread_timer_init(&_data_thread_timer);
  golf_mutex_init(&_loaded_data_lock);
  memset(&_loaded_data,0,0x958);
  _loaded_data.alloc_category = "data";
  golf_mutex_init(&_files_to_load_lock);
  memset(&_files_to_load,0,0x18);
  _files_to_load.alloc_category = "data";
  golf_mutex_init(&_seen_files_lock);
  memset(&_seen_files,0,0x18);
  _seen_files.alloc_category = "data";
  golf_mutex_init(&_file_events_lock);
  memset(&_file_events,0,0x18);
  _file_events.alloc_category = "data";
  golf_mutex_init(&_assetsys_lock);
  _assetsys = assetsys_create((void *)0x0);
  memset(&_file_time_map,0,0x28);
  _file_time_map.alloc_category = "data";
  local_c = assetsys_mount(_assetsys,"data",(char *)0x0,0,"/data");
  if (local_c != ASSETSYS_SUCCESS) {
    golf_log_error("Unable to mount data, error: %d",(ulong)(uint)local_c);
  }
  local_d = 0;
  golf_dir_recurse("data",_golf_data_handle_file,&local_d);
  qsort(_seen_files.data,(long)_seen_files.length,0x920,_file_alpha_cmp);
  golf_thread_create(_golf_data_thread_fn,(void *)0x0,"_golf_data_thread_fn");
  return;
}

Assistant:

void golf_data_init(void) {
    golf_thread_timer_init(&_main_thread_timer);
    golf_thread_timer_init(&_data_thread_timer);
    golf_mutex_init(&_loaded_data_lock);
    map_init(&_loaded_data, "data");
    golf_mutex_init(&_files_to_load_lock);
    vec_init(&_files_to_load, "data");
    golf_mutex_init(&_seen_files_lock);
    vec_init(&_seen_files, "data");
    golf_mutex_init(&_file_events_lock);
    vec_init(&_file_events, "data");
    golf_mutex_init(&_assetsys_lock);
    _assetsys = assetsys_create(NULL);
    map_init(&_file_time_map, "data");
#if GOLF_PLATFORM_IOS | GOLF_PLATFORM_ANDROID | GOLF_PLATFORM_EMSCRIPTEN
    assetsys_error_t error = assetsys_mount(_assetsys, "data.zip", (const char*)golf_data_zip, sizeof(golf_data_zip), "/data");
#else
    assetsys_error_t error = assetsys_mount(_assetsys, "data", NULL, 0, "/data");
#endif
    if (error != ASSETSYS_SUCCESS) {
        golf_log_error("Unable to mount data, error: %d", (int)error);
    }

    bool push_events = false;
    golf_dir_recurse("data", _golf_data_handle_file, &push_events); 
    qsort(_seen_files.data, _seen_files.length, sizeof(golf_file_t), _file_alpha_cmp);

    golf_thread_create(_golf_data_thread_fn, NULL, "_golf_data_thread_fn");
}